

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool project_aimed(source origin,wchar_t typ,wchar_t dir,wchar_t dam,wchar_t flg,object *obj)

{
  _Bool _Var1;
  source origin_00;
  source origin_01;
  loc_conflict local_30;
  loc_conflict grid;
  wchar_t flg_local;
  wchar_t dam_local;
  wchar_t dir_local;
  wchar_t typ_local;
  source origin_local;
  
  origin_00.which = origin.which;
  origin_00.what = origin.what;
  grid.x = flg;
  grid.y = dam;
  local_30 = (loc_conflict)loc(-1,-1);
  grid.x = grid.x | 4;
  origin_00._4_4_ = 0;
  get_target(origin_00,dir,&local_30,&grid.x);
  origin_01._4_4_ = 0;
  origin_01.what = origin_00.what;
  origin_01.which.trap = origin_00.which.trap;
  _Var1 = project(origin_01,L'\0',local_30,grid.y,typ,grid.x,L'\0','\0',obj);
  return _Var1;
}

Assistant:

static bool project_aimed(struct source origin,
						  int typ, int dir, int dam, int flg,
						  const struct object *obj)
{
	struct loc grid = loc(-1, -1);

	/* Pass through the target if needed */
	flg |= (PROJECT_THRU);

	get_target(origin, dir, &grid, &flg);

	/* Aim at the target, do NOT explode */
	return (project(origin, 0, grid, dam, typ, flg, 0, 0, obj));
}